

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O0

FxExpression * __thiscall FxAbs::Resolve(FxAbs *this,FCompileContext *ctx)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  undefined4 extraout_var;
  FxConstant *this_00;
  FxExpression *size;
  ExpVal local_60;
  FxConstant *local_50;
  FxExpression *x;
  undefined1 local_38 [8];
  ExpVal value;
  FxExpression *v;
  FCompileContext *ctx_local;
  FxAbs *this_local;
  
  if (((this->super_FxExpression).isresolved & 1U) != 0) {
    return &this->super_FxExpression;
  }
  (this->super_FxExpression).isresolved = true;
  if (this->val != (FxExpression *)0x0) {
    iVar2 = (*this->val->_vptr_FxExpression[2])(this->val,ctx);
    this->val = (FxExpression *)CONCAT44(extraout_var,iVar2);
  }
  if (this->val == (FxExpression *)0x0) {
    if (this != (FxAbs *)0x0) {
      (*(this->super_FxExpression)._vptr_FxExpression[1])();
    }
    return (FxExpression *)0x0;
  }
  if (this->val->ValueType == (PType *)TypeBool) {
    value.field_1 = (anon_union_8_3_addc324a_for_ExpVal_1)this->val;
    this->val = (FxExpression *)0x0;
    if (this != (FxAbs *)0x0) {
      (*(this->super_FxExpression)._vptr_FxExpression[1])();
    }
    return (FxExpression *)value.field_1.Float;
  }
  bVar1 = FxExpression::IsNumeric(this->val);
  if (!bVar1) {
    FScriptPosition::Message(&(this->super_FxExpression).ScriptPosition,2,"Numeric type expected");
    if (this != (FxAbs *)0x0) {
      (*(this->super_FxExpression)._vptr_FxExpression[1])();
    }
    return (FxExpression *)0x0;
  }
  uVar3 = (*this->val->_vptr_FxExpression[3])();
  if ((uVar3 & 1) == 0) {
    (this->super_FxExpression).ValueType = this->val->ValueType;
    return &this->super_FxExpression;
  }
  size = this->val;
  FxConstant::GetValue((FxConstant *)local_38);
  iVar2 = PType::GetRegType((PType *)local_38);
  if (iVar2 == 0) {
    iVar2 = (int)value.Type;
    if ((int)value.Type < 1) {
      iVar2 = -(int)value.Type;
    }
    value.Type = (PType *)CONCAT44(value.Type._4_4_,iVar2);
  }
  else {
    if (iVar2 != 1) {
      if (this != (FxAbs *)0x0) {
        (*(this->super_FxExpression)._vptr_FxExpression[1])();
      }
      this_local = (FxAbs *)0x0;
      goto LAB_0076a03e;
    }
    value.Type = (PType *)((ulong)value.Type & 0x7fffffffffffffff);
  }
  this_00 = (FxConstant *)FxExpression::operator_new((FxExpression *)0x38,(size_t)size);
  ExpVal::ExpVal(&local_60,(ExpVal *)local_38);
  FxConstant::FxConstant(this_00,&local_60,&(this->super_FxExpression).ScriptPosition);
  ExpVal::~ExpVal(&local_60);
  local_50 = this_00;
  if (this != (FxAbs *)0x0) {
    (*(this->super_FxExpression)._vptr_FxExpression[1])();
  }
  this_local = (FxAbs *)local_50;
LAB_0076a03e:
  x._0_4_ = 1;
  ExpVal::~ExpVal((ExpVal *)local_38);
  return &this_local->super_FxExpression;
}

Assistant:

FxExpression *FxAbs::Resolve(FCompileContext &ctx)
{
	CHECKRESOLVED();
	SAFE_RESOLVE(val, ctx);

	if (val->ValueType == TypeBool)	// abs of a boolean is always the same as the operand
	{
		auto v = val;
		val = nullptr;
		delete this;
		return v;
	}
	if (!val->IsNumeric())
	{
		ScriptPosition.Message(MSG_ERROR, "Numeric type expected");
		delete this;
		return nullptr;
	}
	else if (val->isConstant())
	{
		ExpVal value = static_cast<FxConstant *>(val)->GetValue();
		switch (value.Type->GetRegType())
		{
		case REGT_INT:
			value.Int = abs(value.Int);
			break;

		case REGT_FLOAT:
			value.Float = fabs(value.Float);
			break;

		default:
			// shouldn't happen
			delete this;
			return nullptr;
		}
		FxExpression *x = new FxConstant(value, ScriptPosition);
		delete this;
		return x;
	}
	ValueType = val->ValueType;
	return this;
}